

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall
cmGraphVizWriter::WriteDependerConnections
          (cmGraphVizWriter *this,string *targetName,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedNodes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedConnections,cmGeneratedFileStream *str)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Link_type __s2;
  _Base_ptr __n;
  bool bVar3;
  TargetType targetType;
  int iVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  _Base_ptr p_Var7;
  iterator iVar8;
  ostream *poVar9;
  _Rb_tree_node_base *p_Var10;
  cmGlobalGenerator *globalGenerator;
  LinkLibraryScopeType *type;
  _Link_type __x;
  _Link_type __k;
  string myNodeName;
  string connectionName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
  ll;
  cmGlobalGenerator *local_d8;
  long local_d0;
  undefined1 local_c8 [48];
  undefined1 local_98 [48];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
  local_60;
  
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
          ::find(&(this->TargetPtrs)._M_t,targetName);
  p_Var1 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header;
  if (((_Rb_tree_header *)cVar5._M_node != p_Var1) &&
     (WriteNode(this,targetName,*(cmGeneratorTarget **)(cVar5._M_node + 2),insertedNodes,str),
     *(long *)(cVar5._M_node + 2) != 0)) {
    local_68 = &this->TargetNamesNodes;
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_68->_M_t,targetName);
    globalGenerator = (cmGlobalGenerator *)local_c8;
    local_d8 = globalGenerator;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,*(long *)(cVar6._M_node + 2),
               (long)&(cVar6._M_node[2]._M_parent)->_M_color + *(long *)(cVar6._M_node + 2));
    p_Var10 = (this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      p_Var2 = &local_60._M_t._M_impl.super__Rb_tree_header;
      local_98._40_8_ = &(this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header;
      local_98._32_8_ = &(insertedConnections->_M_t)._M_impl.super__Rb_tree_header;
      do {
        if (*(cmGeneratorTarget **)(p_Var10 + 2) != (cmGeneratorTarget *)0x0) {
          targetType = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var10 + 2));
          bVar3 = GenerateForTargetType(this,targetType);
          if (bVar3) {
            __x = (_Link_type)**(undefined8 **)(p_Var10 + 2);
            (anonymous_namespace)::getScopedLinkLibrariesFromTarget_abi_cxx11_
                      (&local_60,(_anonymous_namespace_ *)__x,(cmTarget *)this->GlobalGenerator,
                       globalGenerator);
            if ((_Rb_tree_header *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
                p_Var2) {
              __k = (_Link_type)(p_Var10 + 1);
              __s2 = (_Link_type)(targetName->_M_dataplus)._M_p;
              __n = (_Base_ptr)targetName->_M_string_length;
              p_Var7 = local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              do {
                if ((p_Var7[1]._M_parent == __n) &&
                   ((__n == (_Base_ptr)0x0 ||
                    (__x = __s2, iVar4 = bcmp(*(void **)(p_Var7 + 1),__s2,(size_t)__n), iVar4 == 0))
                   )) {
                  __x = __k;
                  cVar6 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::find(&local_68->_M_t,(key_type *)__k);
                  if (cVar6._M_node != (_Base_ptr)local_98._40_8_) {
                    local_98._0_8_ = local_98 + 0x10;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_98,*(long *)(cVar6._M_node + 2),
                               (long)&(cVar6._M_node[2]._M_parent)->_M_color +
                               *(long *)(cVar6._M_node + 2));
                    std::__cxx11::string::append((char *)local_98);
                    std::__cxx11::string::_M_append((char *)local_98,(ulong)local_d8);
                    __x = (_Link_type)local_98;
                    iVar8 = std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::find(&insertedConnections->_M_t,(key_type *)local_98);
                    if (iVar8._M_node == (_Base_ptr)local_98._32_8_) {
                      std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)insertedConnections,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_98);
                      WriteNode(this,(string *)__k,*(cmGeneratorTarget **)(p_Var10 + 2),
                                insertedNodes,str);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)str,"    \"",5);
                      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)str,*(char **)(cVar6._M_node + 2),
                                          (long)cVar6._M_node[2]._M_parent);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" -> \"",6);
                      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar9,(char *)local_d8,local_d0);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
                      std::__ostream_insert<char,std::char_traits<char>>((ostream *)str," // ",4);
                      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)str,(targetName->_M_dataplus)._M_p,
                                          targetName->_M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9," -> ",4);
                      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar9,*(char **)(p_Var10 + 1),(long)p_Var10[1]._M_parent)
                      ;
                      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
                      std::ostream::put((char)poVar9);
                      std::ostream::flush();
                      (anonymous_namespace)::getLinkLibraryStyle_abi_cxx11_
                                ((string *)(local_c8 + 0x10),
                                 (_anonymous_namespace_ *)(ulong)p_Var7[2]._M_color,type);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)str,(char *)local_c8._16_8_,local_c8._24_8_);
                      if ((undefined1 *)local_c8._16_8_ != local_c8 + 0x20) {
                        operator_delete((void *)local_c8._16_8_,local_c8._32_8_ + 1);
                      }
                      globalGenerator = (cmGlobalGenerator *)insertedConnections;
                      WriteDependerConnections
                                (this,(string *)__k,insertedNodes,insertedConnections,str);
                      __x = __k;
                    }
                    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
                      __x = (_Link_type)((long)(_Rb_tree_color *)local_98._16_8_ + 1);
                      operator_delete((void *)local_98._0_8_,(ulong)__x);
                    }
                  }
                  break;
                }
                p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
              } while ((_Rb_tree_header *)p_Var7 != p_Var2);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                        *)local_60._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
          }
        }
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var1);
    }
    if (local_d8 != (cmGlobalGenerator *)local_c8) {
      operator_delete(local_d8,local_c8._0_8_ + 1);
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteDependerConnections(
  const std::string& targetName, std::set<std::string>& insertedNodes,
  std::set<std::string>& insertedConnections, cmGeneratedFileStream& str) const
{
  std::map<std::string, const cmGeneratorTarget*>::const_iterator targetPtrIt =
    this->TargetPtrs.find(targetName);

  if (targetPtrIt == this->TargetPtrs.end()) // not found at all
  {
    return;
  }

  this->WriteNode(targetName, targetPtrIt->second, insertedNodes, str);

  if (targetPtrIt->second == nullptr) // it's an external library
  {
    return;
  }

  std::string myNodeName = this->TargetNamesNodes.find(targetName)->second;

  // now search who links against me
  for (auto const& tptr : this->TargetPtrs) {
    if (tptr.second == nullptr) {
      continue;
    }

    if (!this->GenerateForTargetType(tptr.second->GetType())) {
      continue;
    }

    // Now we have a target, check whether it links against targetName.
    // If so, draw a connection, and then continue with dependers on that one.
    std::map<std::string, LinkLibraryScopeType> ll =
      getScopedLinkLibrariesFromTarget(tptr.second->Target, GlobalGenerator);

    for (auto const& llit : ll) {
      if (llit.first == targetName) {
        // So this target links against targetName.
        std::map<std::string, std::string>::const_iterator dependerNodeNameIt =
          this->TargetNamesNodes.find(tptr.first);

        if (dependerNodeNameIt != this->TargetNamesNodes.end()) {
          std::string connectionName = dependerNodeNameIt->second;
          connectionName += "-";
          connectionName += myNodeName;

          if (insertedConnections.find(connectionName) ==
              insertedConnections.end()) {
            insertedConnections.insert(connectionName);
            this->WriteNode(tptr.first, tptr.second, insertedNodes, str);

            str << "    \"" << dependerNodeNameIt->second << "\" -> \""
                << myNodeName << "\"";
            str << " // " << targetName << " -> " << tptr.first << std::endl;
            str << getLinkLibraryStyle(llit.second);
            this->WriteDependerConnections(tptr.first, insertedNodes,
                                           insertedConnections, str);
          }
        }
        break;
      }
    }
  }
}